

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DFAContentModel::checkUniqueParticleAttribution
          (DFAContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  Occurence *pOVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar5;
  XMLCh *text3;
  undefined1 local_100 [8];
  XMLBuffer buf2;
  XMLBuffer buf1;
  Occurence *o;
  ConflictTableKeeper keeper;
  char **conflictTable;
  uint local_54;
  uint orgURIIndex;
  uint k;
  uint j;
  uint i;
  SubstitutionGroupComparator comparator;
  uint *pContentSpecOrgURI_local;
  XMLValidator *pValidator_local;
  XMLStringPool *pStringPool_local;
  GrammarResolver *pGrammarResolver_local;
  SchemaGrammar *pGrammar_local;
  DFAContentModel *this_local;
  
  comparator.fStringPool = (XMLStringPool *)pContentSpecOrgURI;
  SubstitutionGroupComparator::SubstitutionGroupComparator
            ((SubstitutionGroupComparator *)&j,pGrammarResolver,pStringPool);
  for (k = 0; k < this->fElemMapSize; k = k + 1) {
    uVar3 = QName::getURI(this->fElemMap[k]);
    if ((((uVar3 != 0xfffffff1) && (uVar3 != 0xfffffff2)) && (uVar3 != 0xfffffffe)) &&
       (uVar3 != 0xffffffff)) {
      QName::setURI(this->fElemMap[k],
                    *(uint *)((long)&((comparator.fStringPool)->super_XSerializable).
                                     _vptr_XSerializable + (ulong)uVar3 * 4));
    }
  }
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  keeper._16_8_ = CONCAT44(extraout_var,iVar4);
  memset((void *)keeper._16_8_,0,(ulong)this->fElemMapSize << 3);
  checkUniqueParticleAttribution(xercesc_4_0::SchemaGrammar*,xercesc_4_0::
  GrammarResolver*,xercesc_4_0::XMLStringPool*,xercesc_4_0::
  XMLValidator*,unsigned_int*,char16_t_const*)::ConflictTableKeeper::ConflictTableKeeper(xercesc_4_0
  ::MemoryManager__signed_char___unsigned_int_
            (&o,this->fMemoryManager,(char **)keeper._16_8_,this->fElemMapSize);
  for (orgURIIndex = 0; orgURIIndex < this->fElemMapSize; orgURIIndex = orgURIIndex + 1) {
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)this->fElemMapSize);
    *(ulong *)(keeper._16_8_ + (ulong)orgURIIndex * 8) = CONCAT44(extraout_var_00,iVar4);
    memset(*(void **)(keeper._16_8_ + (ulong)orgURIIndex * 8),0,(ulong)this->fElemMapSize);
  }
  for (k = 0; k < this->fTransTableSize; k = k + 1) {
    for (orgURIIndex = 0; orgURIIndex < this->fElemMapSize; orgURIIndex = orgURIIndex + 1) {
      local_54 = orgURIIndex;
      if (this->fTransTable[k][orgURIIndex] != 0xffffffff) {
        while (local_54 = local_54 + 1, local_54 < this->fElemMapSize) {
          if (((this->fTransTable[k][local_54] != 0xffffffff) &&
              (*(char *)(*(long *)(keeper._16_8_ + (ulong)orgURIIndex * 8) + (ulong)local_54) ==
               '\0')) &&
             (((this->fIsMixed & 1U) == 0 ||
              ((uVar3 = QName::getURI(this->fElemMap[orgURIIndex]), uVar3 != 0xffffffff &&
               (uVar3 = QName::getURI(this->fElemMap[local_54]), uVar3 != 0xffffffff)))))) {
            bVar2 = XercesElementWildcard::conflict
                              (pGrammar,this->fElemMapType[orgURIIndex],this->fElemMap[orgURIIndex],
                               this->fElemMapType[local_54],this->fElemMap[local_54],
                               (SubstitutionGroupComparator *)&j);
            if (bVar2) {
              if ((((this->fCountingStates == (Occurence **)0x0) ||
                   (pOVar1 = this->fCountingStates[k], pOVar1 == (Occurence *)0x0)) ||
                  ((this->fTransTable[k][orgURIIndex] == k) == (this->fTransTable[k][local_54] == k)
                  )) || (pOVar1->minOccurs != pOVar1->maxOccurs)) {
                *(undefined1 *)(*(long *)(keeper._16_8_ + (ulong)orgURIIndex * 8) + (ulong)local_54)
                     = 1;
                XMLBuffer::XMLBuffer((XMLBuffer *)&buf2.fBuffer,0x3ff,this->fMemoryManager);
                if (((this->fElemMapType[orgURIIndex] & (Any_NS|Any_Other)) == Any) ||
                   ((this->fElemMapType[orgURIIndex] & (Any_NS|Any_Other)) == Any_NS)) {
                  XMLBuffer::set((XMLBuffer *)&buf2.fBuffer,
                                 (XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                }
                else if ((this->fElemMapType[orgURIIndex] & (Any_NS|Any_Other)) == Any_Other) {
                  XMLBuffer::set((XMLBuffer *)&buf2.fBuffer,
                                 (XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                }
                else {
                  pXVar5 = QName::getRawName(this->fElemMap[orgURIIndex]);
                  XMLBuffer::set((XMLBuffer *)&buf2.fBuffer,pXVar5);
                }
                XMLBuffer::XMLBuffer((XMLBuffer *)local_100,0x3ff,this->fMemoryManager);
                if (((this->fElemMapType[local_54] & (Any_NS|Any_Other)) == Any) ||
                   ((this->fElemMapType[local_54] & (Any_NS|Any_Other)) == Any_NS)) {
                  XMLBuffer::set((XMLBuffer *)local_100,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDANY
                                );
                }
                else if ((this->fElemMapType[local_54] & (Any_NS|Any_Other)) == Any_Other) {
                  XMLBuffer::set((XMLBuffer *)local_100,
                                 (XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                }
                else {
                  pXVar5 = QName::getRawName(this->fElemMap[local_54]);
                  XMLBuffer::set((XMLBuffer *)local_100,pXVar5);
                }
                pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)&buf2.fBuffer);
                text3 = XMLBuffer::getRawBuffer((XMLBuffer *)local_100);
                XMLValidator::emitError
                          (pValidator,UniqueParticleAttributionFail,pComplexTypeName,pXVar5,text3,
                           (XMLCh *)0x0);
                XMLBuffer::~XMLBuffer((XMLBuffer *)local_100);
                XMLBuffer::~XMLBuffer((XMLBuffer *)&buf2.fBuffer);
              }
              else {
                *(undefined1 *)(*(long *)(keeper._16_8_ + (ulong)orgURIIndex * 8) + (ulong)local_54)
                     = 0xff;
              }
            }
            else {
              *(undefined1 *)(*(long *)(keeper._16_8_ + (ulong)orgURIIndex * 8) + (ulong)local_54) =
                   0xff;
            }
          }
        }
      }
    }
  }
  checkUniqueParticleAttribution::ConflictTableKeeper::~ConflictTableKeeper
            ((ConflictTableKeeper *)&o);
  SubstitutionGroupComparator::~SubstitutionGroupComparator((SubstitutionGroupComparator *)&j);
  return;
}

Assistant:

void DFAContentModel::checkUniqueParticleAttribution (SchemaGrammar*    const pGrammar,
                                                      GrammarResolver*  const pGrammarResolver,
                                                      XMLStringPool*    const pStringPool,
                                                      XMLValidator*     const pValidator,
                                                      unsigned int*     const pContentSpecOrgURI,
                                                      const XMLCh*            pComplexTypeName /*= 0*/)
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    unsigned int i, j, k;

    // Rename the URI back
    for (i = 0; i < fElemMapSize; i++) {

        unsigned int orgURIIndex = fElemMap[i]->getURI();

        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLContentModel::gEpsilonFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId)) {
            fElemMap[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
        }
    }

    // Unique Particle Attribution
    // Store the conflict results between any two elements in fElemMap
    // 0 - not yet tested, 1 - conflict, (-1) - no conflict
    signed char** conflictTable = (signed char**) fMemoryManager->allocate
    (
        fElemMapSize * sizeof(signed char*)
    );
    memset(conflictTable, 0, fElemMapSize * sizeof(signed char*));

    struct ConflictTableKeeper
    {
        MemoryManager* fMemoryManager;
        signed char**  fConflictTable;
        unsigned int   fElemMapSize;

        ConflictTableKeeper(MemoryManager* memoryManager,
                            signed char** conflictTable,
                            unsigned int elemMapSize):
            fMemoryManager(memoryManager),
            fConflictTable(conflictTable),
            fElemMapSize(elemMapSize)
        {
        }

        ~ConflictTableKeeper()
        {
            for (int i = 0; i < fElemMapSize; i++)
                fMemoryManager->deallocate(fConflictTable[i]);
            fMemoryManager->deallocate(fConflictTable);
        }
    };

    ConflictTableKeeper keeper(fMemoryManager, conflictTable, fElemMapSize);

    // initialize the conflict table
    for (j = 0; j < fElemMapSize; j++) {
        conflictTable[j] = (signed char*) fMemoryManager->allocate
        (
            fElemMapSize * sizeof(signed char)
        );
        memset(conflictTable[j], 0, fElemMapSize*sizeof(signed char));
    }

    // for each state, check whether it has overlap transitions
    for (i = 0; i < fTransTableSize; i++) {
        for (j = 0; j < fElemMapSize; j++) {
            if (fTransTable[i][j] == XMLContentModel::gInvalidTrans)
                continue;
            for (k = j+1; k < fElemMapSize; k++) {
                if (fTransTable[i][k] != XMLContentModel::gInvalidTrans &&
                    conflictTable[j][k] == 0) {

                    // If this is text in a Schema mixed content model, skip it.
                    if ( fIsMixed &&
                         (( fElemMap[j]->getURI() == XMLElementDecl::fgPCDataElemId) ||
                          ( fElemMap[k]->getURI() == XMLElementDecl::fgPCDataElemId)))
                        continue;

                    if (XercesElementWildcard::conflict(pGrammar,
                                                        fElemMapType[j],
                                                        fElemMap[j],
                                                        fElemMapType[k],
                                                        fElemMap[k],
                                                        &comparator)) {
                        if (fCountingStates != 0) {
                            Occurence* o = fCountingStates[i];
                            // If "i" is a counting state and exactly one of the transitions
                            // loops back to "i" then the two particles do not overlap if
                            // minOccurs == maxOccurs.
                            if (o != 0 &&
                                ((fTransTable[i][j] == i) ^ (fTransTable[i][k] == i)) &&
                                o->minOccurs == o->maxOccurs) {
                                conflictTable[j][k] = -1;
                                continue;
                            }
                        }
                       conflictTable[j][k] = 1;

                       XMLBuffer buf1(1023, fMemoryManager);
                       if (((fElemMapType[j] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_NS))
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_Other)
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf1.set(fElemMap[j]->getRawName());

                       XMLBuffer buf2(1023, fMemoryManager);
                       if (((fElemMapType[k] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_NS))
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_Other)
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf2.set(fElemMap[k]->getRawName());

                       pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                             pComplexTypeName,
                                             buf1.getRawBuffer(),
                                             buf2.getRawBuffer());
                    }
                    else
                        conflictTable[j][k] = -1;
                }
            }
        }
    }
}